

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O3

void __thiscall QGraphicsRotation::setOrigin(QGraphicsRotation *this,QVector3D *point)

{
  undefined1 *puVar1;
  long lVar2;
  QGraphicsItem *this_00;
  float fVar3;
  float fVar4;
  
  lVar2 = *(long *)(this + 8);
  fVar3 = (float)*(undefined8 *)(lVar2 + 0x80);
  fVar4 = (float)*(undefined8 *)point->v;
  if ((((fVar3 == fVar4) && (!NAN(fVar3) && !NAN(fVar4))) &&
      ((float)((ulong)*(undefined8 *)(lVar2 + 0x80) >> 0x20) ==
       (float)((ulong)*(undefined8 *)point->v >> 0x20))) &&
     ((*(float *)(lVar2 + 0x88) == point->v[2] &&
      (!NAN(*(float *)(lVar2 + 0x88)) && !NAN(point->v[2]))))) {
    return;
  }
  *(float *)(lVar2 + 0x88) = point->v[2];
  *(undefined8 *)(lVar2 + 0x80) = *(undefined8 *)point->v;
  this_00 = *(QGraphicsItem **)(*(long *)(this + 8) + 0x78);
  if (this_00 != (QGraphicsItem *)0x0) {
    QGraphicsItem::prepareGeometryChange(this_00);
    puVar1 = &((this_00->d_ptr).d)->field_0x160;
    *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
  }
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)0x0);
  return;
}

Assistant:

void QGraphicsRotation::setOrigin(const QVector3D &point)
{
    Q_D(QGraphicsRotation);
    if (d->origin == point)
        return;
    d->origin = point;
    update();
    emit originChanged();
}